

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall
Liby::http::HttpClient::HttpClient(HttpClient *this,EventLoopGroup *group,string *host)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined8 uVar2;
  _Any_data local_68;
  _Manager_type local_58;
  code *pcStack_50;
  element_type *local_48;
  _Any_data _Stack_40;
  
  _Stack_40._8_8_ = &(this->host_).field_2;
  (this->host_)._M_dataplus._M_p = (pointer)_Stack_40._8_8_;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  (this->parser_).super_Reply.content_.buffer_ = (char *)0x0;
  (this->parser_).super_Reply.content_.leftIndex_ = 0;
  (this->parser_).super_Reply.content_.rightIndex_ = 0;
  (this->parser_).super_Reply.content_.capacity_ = 0;
  (this->parser_).super_Reply.headers_._M_h._M_buckets =
       &(this->parser_).super_Reply.headers_._M_h._M_single_bucket;
  (this->parser_).super_Reply.headers_._M_h._M_bucket_count = 1;
  (this->parser_).super_Reply.headers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->parser_).super_Reply.headers_._M_h._M_element_count = 0;
  (this->parser_).super_Reply.headers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->parser_).super_Reply.headers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->parser_).super_Reply.headers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->parser_).bytes_ = 0;
  (this->parser_).progress_ = 0;
  (this->requestLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->requestLists_;
  (this->requestLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->requestLists_;
  (this->requestLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->sendReqeustLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->sendReqeustLists_;
  (this->sendReqeustLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->sendReqeustLists_;
  (this->sendReqeustLists_).
  super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  local_68._M_unused._M_object = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"80","");
  EventLoopGroup::creatTcpClient((EventLoopGroup *)&local_48,(string *)group,host);
  uVar2 = _Stack_40._M_unused._0_8_;
  peVar1 = local_48;
  local_48 = (element_type *)0x0;
  _Stack_40._M_unused._M_object = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_unused._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_unused._0_8_);
  }
  if ((_Manager_type *)local_68._M_unused._0_8_ != &local_58) {
    operator_delete(local_68._M_unused._M_object);
  }
  local_68._8_8_ = 0;
  pcStack_50 = std::
               _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:11:29)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:11:29)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  TcpClient::onConnect
            ((this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(Connector *)&local_68);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

HttpClient::HttpClient(EventLoopGroup &group, const std::string &host) {
    host_ = host;
    http_client_ = group.creatTcpClient(host, "80");
    http_client_->onConnect([this](ConnPtr conn) { handleConnection(conn); });
}